

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::SliderAngle(char *label,float *v_rad,float v_degrees_min,float v_degrees_max,
                       char *format)

{
  bool bVar1;
  char *in_RDX;
  float *in_RSI;
  undefined4 in_XMM0_Da;
  float fVar2;
  undefined4 in_XMM1_Da;
  bool value_changed;
  float v_deg;
  undefined4 in_stack_ffffffffffffffd8;
  
  if (in_RDX == (char *)0x0) {
    in_RDX = "%.0f deg";
  }
  fVar2 = (*in_RSI * 360.0) / 6.2831855;
  bVar1 = SliderFloat((char *)in_RSI,(float *)CONCAT44(in_XMM0_Da,in_XMM1_Da),
                      (float)((ulong)in_RDX >> 0x20),SUB84(in_RDX,0),
                      (char *)CONCAT44(fVar2,in_stack_ffffffffffffffd8),0.0);
  *in_RSI = (fVar2 * 6.2831855) / 360.0;
  return bVar1;
}

Assistant:

bool ImGui::SliderAngle(const char* label, float* v_rad, float v_degrees_min, float v_degrees_max, const char* format)
{
    if (format == NULL)
        format = "%.0f deg";
    float v_deg = (*v_rad) * 360.0f / (2*IM_PI);
    bool value_changed = SliderFloat(label, &v_deg, v_degrees_min, v_degrees_max, format, 1.0f);
    *v_rad = v_deg * (2*IM_PI) / 360.0f;
    return value_changed;
}